

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

int Abc_NodeCompareIndexes(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  int iVar1;
  int Diff;
  Abc_Obj_t **pp2_local;
  Abc_Obj_t **pp1_local;
  
  iVar1 = ((*pp1)->field_6).iTemp - ((*pp2)->field_6).iTemp;
  if (iVar1 < 0) {
    pp1_local._4_4_ = -1;
  }
  else if (iVar1 < 1) {
    pp1_local._4_4_ = 0;
  }
  else {
    pp1_local._4_4_ = 1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Abc_NodeCompareIndexes( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    int Diff = (*pp1)->iTemp - (*pp2)->iTemp;
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}